

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffDistTest2<unsigned_long,unsigned_long>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  byte in_SIL;
  code *in_RDI;
  int i;
  int keybit;
  bool result;
  unsigned_long h2;
  unsigned_long h1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unsigned_long k;
  int keycount;
  int keybits;
  Rand r;
  byte bVar4;
  uint32_t in_stack_ffffffffffffff6c;
  Rand *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint bit;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar5;
  Rand *in_stack_ffffffffffffff90;
  ulong local_68 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 local_30 [12];
  undefined4 local_24;
  int local_20;
  byte local_9;
  code *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  Rand::Rand(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  local_20 = 0x40;
  local_24 = 0x200000;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x14b499);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x14b4b9);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
  for (bit = 0; (int)bit < local_20; bit = bit + 1) {
    printf("Testing bit %d\n",(ulong)bit);
    for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < 0x200000;
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      Rand::rand_p(in_stack_ffffffffffffff90,(void *)CONCAT44(uVar5,bit),in_stack_ffffffffffffff84);
      (*local_8)(local_30,8,0,local_68);
      flipbit(local_30,8,bit);
      (*local_8)(local_30,8,0,&stack0xffffffffffffff90);
      uVar2 = local_68[0] ^ (ulong)in_stack_ffffffffffffff90;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_48,(long)in_stack_ffffffffffffff84);
      *pvVar3 = uVar2;
    }
    bVar1 = TestHashList<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish._7_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish._6_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish._5_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish._4_1_,
                       hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish._3_1_);
    uVar5 = CONCAT13(bVar1 & (byte)((uint)uVar5 >> 0x18),(int3)uVar5);
    printf("\n");
  }
  bVar4 = (byte)((uint)uVar5 >> 0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return (bool)(bVar4 & 1);
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}